

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsTaskExecutor.h
# Opt level: O0

void __thiscall HighsTaskExecutor::stopWorkerThreads(HighsTaskExecutor *this,bool blocking)

{
  bool bVar1;
  byte in_SIL;
  HighsSplitDeque *in_RDI;
  thread *workerThread_1;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::thread,_std::allocator<std::thread>_> *__range2_1;
  thread *workerThread;
  iterator __end2;
  iterator __begin2;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_> *workerDeque;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>,_std::allocator<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>_>_>
  *__range1;
  ExecutorHandle *executorHandle;
  HighsTask *in_stack_ffffffffffffff78;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_> local_68
  ;
  HighsTask **local_60;
  reference local_58;
  thread *local_50;
  __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_> local_48
  ;
  HighsTask **local_40;
  reference local_38;
  unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_> *local_30;
  __normal_iterator<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>_*,_std::vector<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>,_std::allocator<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>_>_>_>
  local_28;
  HighsRandom *local_20;
  ExecutorHandle *local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  local_18 = threadLocalExecutorHandle();
  if ((local_18->ptr != (HighsTaskExecutor *)0x0) &&
     (bVar1 = std::atomic<bool>::exchange
                        ((atomic<bool> *)
                         ((long)&(in_RDI->ownerData).workerBunk.
                                 super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + 4),true,memory_order_seq_cst), !bVar1)) {
    local_20 = &(in_RDI->ownerData).randgen;
    local_28._M_current =
         (unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_> *)
         std::
         vector<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>,_std::allocator<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>_>_>
         ::begin((vector<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>,_std::allocator<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>_>_>
                  *)in_stack_ffffffffffffff78);
    local_30 = (unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_> *)
               std::
               vector<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>,_std::allocator<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>_>_>
               ::end((vector<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>,_std::allocator<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>_>_>
                      *)in_stack_ffffffffffffff78);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>_*,_std::vector<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>,_std::allocator<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>_>_>_>
                               *)in_RDI,
                              (__normal_iterator<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>_*,_std::vector<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>,_std::allocator<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>_>_>_>
                               *)in_stack_ffffffffffffff78), bVar1) {
      local_38 = __gnu_cxx::
                 __normal_iterator<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>_*,_std::vector<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>,_std::allocator<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>_>_>_>
                 ::operator*(&local_28);
      std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>::operator->
                ((unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_> *)
                 0x4c6e57);
      HighsSplitDeque::injectTaskAndNotify(in_RDI,in_stack_ffffffffffffff78);
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>_*,_std::vector<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>,_std::allocator<std::unique_ptr<HighsSplitDeque,_highs::cache_aligned::Deleter<HighsSplitDeque>_>_>_>_>
      ::operator++(&local_28);
    }
    if (((local_9 & 1) == 0) || ((local_18->isMain & 1U) == 0)) {
      local_60 = &(in_RDI->ownerData).rootTask;
      local_68._M_current =
           (thread *)
           std::vector<std::thread,_std::allocator<std::thread>_>::begin
                     ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_ffffffffffffff78
                     );
      std::vector<std::thread,_std::allocator<std::thread>_>::end
                ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_ffffffffffffff78);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                 *)in_RDI,
                                (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                 *)in_stack_ffffffffffffff78), bVar1) {
        __gnu_cxx::
        __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
        operator*(&local_68);
        std::thread::detach();
        __gnu_cxx::
        __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
        operator++(&local_68);
      }
    }
    else {
      local_40 = &(in_RDI->ownerData).rootTask;
      local_48._M_current =
           (thread *)
           std::vector<std::thread,_std::allocator<std::thread>_>::begin
                     ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_ffffffffffffff78
                     );
      local_50 = (thread *)
                 std::vector<std::thread,_std::allocator<std::thread>_>::end
                           ((vector<std::thread,_std::allocator<std::thread>_> *)
                            in_stack_ffffffffffffff78);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                 *)in_RDI,
                                (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                 *)in_stack_ffffffffffffff78), bVar1) {
        local_58 = __gnu_cxx::
                   __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                   ::operator*(&local_48);
        std::thread::join();
        __gnu_cxx::
        __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
        operator++(&local_48);
      }
    }
  }
  return;
}

Assistant:

void stopWorkerThreads(bool blocking = false) {
    // Check if stop has been called already.
    auto& executorHandle = threadLocalExecutorHandle();
    if (executorHandle.ptr == nullptr || hasStopped.exchange(true)) return;

    // now inject the null task as termination signal to every worker
    for (auto& workerDeque : workerDeques) {
      workerDeque->injectTaskAndNotify(nullptr);
    }

    // only block if called on main thread, otherwise deadlock may occur
    if (blocking && executorHandle.isMain) {
      for (auto& workerThread : workerThreads) {
        workerThread.join();
      }
    } else {
      for (auto& workerThread : workerThreads) {
        workerThread.detach();
      }
    }
  }